

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxx_eventlistener.hpp
# Opt level: O2

void __thiscall
mxx_gtest::MpiTestEventListener::OnTestEnd(MpiTestEventListener *this,TestInfo *test_info)

{
  TestResult *this_00;
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  TestPartResult *pTVar5;
  char *__s;
  int i;
  int len;
  int line_1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  int p;
  int line;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  char local_3d8 [16];
  string message;
  AssertHelper local_398;
  string linestr;
  MPI_Status stat;
  string local_358 [32];
  int end;
  undefined4 uStack_334;
  undefined4 local_330;
  ostream local_328 [376];
  string msg;
  
  if (this->rank == 0) {
    MPI_Comm_size(&ompi_mpi_comm_world,&p);
    for (iVar2 = 1; iVar2 < p; iVar2 = iVar2 + 1) {
      _line = local_3d8;
      local_3e0 = 0;
      local_3d8[0] = '\0';
      message._M_dataplus._M_p = (pointer)&message.field_2;
      message._M_string_length = 0;
      message.field_2._M_local_buf[0] = '\0';
      MPI_Recv(&line_1,1,&ompi_mpi_int,iVar2,0,&ompi_mpi_comm_world,0);
      while (line_1 != -0xd) {
        MPI_Probe(iVar2,0,&ompi_mpi_comm_world,&stat);
        MPI_Get_count(&stat,&ompi_mpi_char,&len);
        std::__cxx11::string::resize((ulong)&line);
        MPI_Recv(_line,len,&ompi_mpi_char,iVar2,0,&ompi_mpi_comm_world,0);
        MPI_Probe(iVar2,0,&ompi_mpi_comm_world,&stat);
        MPI_Get_count(&stat,&ompi_mpi_char,&len);
        std::__cxx11::string::resize((ulong)&message);
        MPI_Recv(message._M_dataplus._M_p,len,&ompi_mpi_char,iVar2,0,&ompi_mpi_comm_world,0);
        std::__cxx11::istringstream::istringstream((istringstream *)&msg,(string *)&message,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)&end);
        linestr._M_dataplus._M_p = (pointer)&linestr.field_2;
        linestr._M_string_length = 0;
        linestr.field_2._M_local_buf[0] = '\0';
        while( true ) {
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&msg,(string *)&linestr);
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
          poVar4 = std::operator<<(local_328,"[Rank ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
          poVar4 = std::operator<<(poVar4,"] ");
          poVar4 = std::operator<<(poVar4,(string *)&linestr);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        testing::Message::Message((Message *)&local_3f8);
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)(local_3f8.ptr_ + 0x10),local_358);
        testing::internal::AssertHelper::AssertHelper
                  (&local_398,kNonFatalFailure,_line,line_1,"Failed");
        testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3f8);
        testing::internal::AssertHelper::~AssertHelper(&local_398);
        std::__cxx11::string::~string(local_358);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_3f8);
        MPI_Recv(&line_1,1,&ompi_mpi_int,iVar2,0,&ompi_mpi_comm_world,0);
        std::__cxx11::string::~string((string *)&linestr);
        std::__cxx11::stringstream::~stringstream((stringstream *)&end);
        std::__cxx11::istringstream::~istringstream((istringstream *)&msg);
      }
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&line);
    }
  }
  else {
    this_00 = &test_info->result_;
    bVar1 = testing::TestResult::Passed(this_00);
    if (!bVar1) {
      iVar2 = testing::TestResult::total_part_count(this_00);
      i = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      for (; iVar2 != i; i = i + 1) {
        pTVar5 = testing::TestResult::GetTestPartResult(this_00,i);
        if (pTVar5->type_ != kSuccess) {
          pTVar5 = testing::TestResult::GetTestPartResult(this_00,i);
          _line = (char *)CONCAT44(uStack_3e4,pTVar5->line_number_);
          pTVar5 = testing::TestResult::GetTestPartResult(this_00,i);
          __s = (char *)(pTVar5->file_name_)._M_string_length;
          if (__s != (char *)0x0) {
            __s = (pTVar5->file_name_)._M_dataplus._M_p;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&end,__s,(allocator<char> *)&msg);
          pTVar5 = testing::TestResult::GetTestPartResult(this_00,i);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,(pTVar5->message_)._M_dataplus._M_p,(allocator<char> *)&message)
          ;
          MPI_Send(&line,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
          MPI_Send(CONCAT44(uStack_334,end),local_330,&ompi_mpi_char,0,0,&ompi_mpi_comm_world);
          MPI_Send(msg._M_dataplus._M_p,(undefined4)msg._M_string_length,&ompi_mpi_char,0,0,
                   &ompi_mpi_comm_world);
          std::__cxx11::string::~string((string *)&msg);
          std::__cxx11::string::~string((string *)&end);
        }
      }
    }
    end = -0xd;
    MPI_Send(&end,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
  }
  if (this->rank == 0) {
    (*this->other->_vptr_TestEventListener[9])(this->other,test_info);
  }
  return;
}

Assistant:

virtual void OnTestEnd(const TestInfo& test_info)
    {
        // serialze all failed TestPartResults and send to rank 0
        // there, receive and ADD_FAILURE_AT() for the remote error

        // first send lineno, since -1 is used by google for unknown line numbers
        // we use -13 for "no more fails"
        if (rank != 0) {
            if (!test_info.result()->Passed()) {
                int count = test_info.result()->total_part_count();
                for (int i = 0; i < count; ++i) {
                    if (!test_info.result()->GetTestPartResult(i).passed()) {
                        // get result information for failed tests
                        int line = test_info.result()->GetTestPartResult(i).line_number();
                        std::string filename(test_info.result()->GetTestPartResult(i).file_name());
                        std::string msg(test_info.result()->GetTestPartResult(i).message());
                        // send info to rank 0
                        // TODO: replace with mxx calls?
                        // TODO: custom communicator?
                        // TODO: use custom `tag`? currently all are tag `0`
                        MPI_Send(&line, 1, MPI_INT, 0, 0, MPI_COMM_WORLD);
                        MPI_Send(&filename[0], filename.size(), MPI_CHAR, 0, 0, MPI_COMM_WORLD);
                        MPI_Send(&msg[0], msg.size(), MPI_CHAR, 0, 0, MPI_COMM_WORLD);
                    }
                }
            }
            // send the END message (line = -13)
            int end = -13;
            MPI_Send(&end, 1, MPI_INT, 0, 0, MPI_COMM_WORLD);
        } else {
            // rank 0: in a for loop over all ranks, receive the failing messages
            int p;
            MPI_Comm_size(MPI_COMM_WORLD, &p);
            for (int i = 1; i < p; ++i)
            {
                int line;
                std::string filename;
                std::string message;
                MPI_Recv(&line, 1, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                while (line != -13) {
                    // receive filename and message
                    // TODO: use mxx std::string overloads for recv
                    MPI_Status stat;
                    int len;
                    // filename
                    MPI_Probe(i, 0, MPI_COMM_WORLD, &stat);
                    MPI_Get_count(&stat, MPI_CHAR, &len);
                    filename.resize(len);
                    MPI_Recv(&filename[0], len, MPI_CHAR, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                    // message
                    MPI_Probe(i, 0, MPI_COMM_WORLD, &stat);
                    MPI_Get_count(&stat, MPI_CHAR, &len);
                    message.resize(len);
                    MPI_Recv(&message[0], len, MPI_CHAR, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

                    // modify message, add `[Rank x]` in front of each line
                    std::istringstream iss(message);
                    std::stringstream ss;
                    std::string linestr;
                    while (std::getline(iss, linestr)) {
                        ss << "[Rank " << i << "] " << linestr << std::endl;
                    }
                    ADD_FAILURE_AT(filename.c_str(), line) << ss.str();

                    // receive next line or end message
                    MPI_Recv(&line, 1, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
                }
            }
        }
        if (rank == 0)
          other->OnTestEnd(test_info);
    }